

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  pointer pMVar3;
  IReporter *pIVar4;
  long in_RSI;
  long in_RDI;
  AssertionResult result;
  ResultBuilder rb;
  const_iterator itEnd;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  ResultBuilder *in_stack_fffffffffffffc50;
  undefined1 local_388 [124];
  Flags in_stack_fffffffffffffcf4;
  char *in_stack_fffffffffffffcf8;
  SourceLineInfo *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  ResultBuilder *in_stack_fffffffffffffd10;
  ResultBuilder *in_stack_fffffffffffffd68;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RSI;
  OVar2 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8));
  if (OVar2 != Ok) {
    local_18._M_current =
         (MessageInfo *)
         std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                   ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                    in_stack_fffffffffffffc48);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
               in_stack_fffffffffffffc48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffc50,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffc48), bVar1) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&local_18);
      if (pMVar3->type == Info) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->(&local_18);
        std::__cxx11::string::c_str();
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->(&local_18);
        ResultBuilder::ResultBuilder
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->(&local_18);
        ResultBuilder::operator<<(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        ResultBuilder::setResultType((ResultBuilder *)&stack0xfffffffffffffd40,Info);
        ResultBuilder::build(in_stack_fffffffffffffd68);
        in_stack_fffffffffffffc50 =
             (ResultBuilder *)
             Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)(in_RDI + 0x10));
        (**(code **)((long)*(NonCopyable *)&in_stack_fffffffffffffc50->m_assertionInfo + 0x80))
                  (in_stack_fffffffffffffc50,local_388);
        AssertionResult::~AssertionResult((AssertionResult *)in_stack_fffffffffffffc50);
        ResultBuilder::~ResultBuilder(in_stack_fffffffffffffc50);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&local_18);
    }
  }
  pIVar4 = Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)(in_RDI + 0x10));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,local_10 + 8);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ResultBuilder rb( it->macroName.c_str(), it->lineInfo, "", ResultDisposition::Normal );
                    rb << it->message;
                    rb.setResultType( ResultWas::Info );
                    AssertionResult result = rb.build();
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }